

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Input::consumeWhitespace(Input *this)

{
  size_t sVar1;
  byte bVar2;
  
  sVar1 = (this->wrapped).size_;
  while ((((sVar1 != 0 && (*(this->wrapped).ptr != '\0')) && (bVar2 = nextChar(this), bVar2 < 0x21))
         && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0))) {
    advance(this,1);
    sVar1 = (this->wrapped).size_;
  }
  return;
}

Assistant:

bool exhausted() {
    return wrapped.size() == 0 || wrapped.front() == '\0';
  }